

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Mesh * __thiscall ON_Mesh::operator=(ON_Mesh *this,ON_Mesh *src)

{
  uint uVar1;
  uint uVar2;
  ON_MeshNgon *ngon_00;
  ON_MeshParameters *__src;
  ON_MeshCurvatureStats *pOVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  float afVar10 [2];
  char cVar11;
  char cVar12;
  char cVar13;
  uint *puVar14;
  ON_MeshParameters *__dest;
  ON_MeshCurvatureStats *this_00;
  int iVar15;
  uint i;
  ulong uVar16;
  long lVar17;
  ulong new_capacity;
  ON_MeshNgon *ngon;
  ON_MeshNgon *local_38;
  
  if (this != src) {
    Destroy(this);
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    ON_3fPointArray::operator=(&this->m_V,&src->m_V);
    ON_3dPointArray::operator=(&this->m_dV,&src->m_dV);
    ON_SimpleArray<ON_MeshFace>::operator=(&this->m_F,&src->m_F);
    ON_3fVectorArray::operator=(&this->m_N,&src->m_N);
    ON_3fVectorArray::operator=(&this->m_FN,&src->m_FN);
    ON_2fPointArray::operator=(&this->m_T,&src->m_T);
    ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&src->m_TC);
    ON_2dPointArray::operator=(&this->m_S,&src->m_S);
    ON_SimpleArray<bool>::operator=(&this->m_H,&src->m_H);
    this->m_hidden_count = src->m_hidden_count;
    uVar1 = (src->m_F).m_count;
    uVar2 = (src->m_Ngon).m_count;
    if (uVar2 != 0 && 0 < (int)uVar1) {
      new_capacity = (ulong)uVar2;
      uVar2 = (src->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      if ((ulong)(long)(this->m_Ngon).m_capacity < new_capacity) {
        ON_SimpleArray<ON_MeshNgon_*>::SetCapacity(&this->m_Ngon,new_capacity);
      }
      uVar16 = 0;
      do {
        ngon_00 = (src->m_Ngon).m_a[uVar16];
        if (((ngon_00 != (ON_MeshNgon *)0x0) && (ngon_00->m_Vcount != 0)) &&
           (ngon_00->m_vi != (uint *)0x0)) {
          if (uVar2 < ngon_00->m_Vcount) {
            iVar15 = 0x220;
          }
          else if (uVar1 < ngon_00->m_Fcount) {
            iVar15 = 0x225;
          }
          else {
            if ((ngon_00->m_Fcount == 0) || (ngon_00->m_fi != (uint *)0x0)) {
              local_38 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,ngon_00);
              if (local_38 != (ON_MeshNgon *)0x0) {
                ON_SimpleArray<ON_MeshNgon_*>::Append(&this->m_Ngon,&local_38);
              }
              goto LAB_004f667c;
            }
            iVar15 = 0x22a;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,iVar15,"","Corrupt ngon");
        }
LAB_004f667c:
        uVar16 = uVar16 + 1;
      } while (new_capacity != uVar16);
      puVar14 = NgonMap(src);
      if (puVar14 != (uint *)0x0) {
        CreateNgonMap(this);
      }
    }
    memcpy(&this->m_Ctag,&src->m_Ctag,0x98);
    memcpy(&this->m_Ttag,&src->m_Ttag,0x98);
    uVar4 = *(undefined8 *)&src->field_0x278;
    *(undefined8 *)&this->field_0x270 = *(undefined8 *)&src->field_0x270;
    *(undefined8 *)&this->field_0x278 = uVar4;
    uVar4 = *(undefined8 *)&src->field_0x288;
    *(undefined8 *)&this->field_0x280 = *(undefined8 *)&src->field_0x280;
    *(undefined8 *)&this->field_0x288 = uVar4;
    uVar4 = *(undefined8 *)&src->field_0x248;
    *(undefined8 *)&this->field_0x240 = *(undefined8 *)&src->field_0x240;
    *(undefined8 *)&this->field_0x248 = uVar4;
    uVar4 = *(undefined8 *)&src->field_0x258;
    *(undefined8 *)&this->field_0x250 = *(undefined8 *)&src->field_0x250;
    *(undefined8 *)&this->field_0x258 = uVar4;
    this->m_srf_scale[0] = src->m_srf_scale[0];
    this->m_srf_scale[1] = src->m_srf_scale[1];
    this->m_packed_tex_rotate = src->m_packed_tex_rotate;
    ON_SimpleArray<ON_SurfaceCurvature>::operator=(&this->m_K,&src->m_K);
    ON_SimpleArray<ON_Color>::operator=(&this->m_C,&src->m_C);
    this->m_parent = src->m_parent;
    if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      operator_delete(this->m_mesh_parameters,0xe0);
      this->m_mesh_parameters = (ON_MeshParameters *)0x0;
    }
    __src = src->m_mesh_parameters;
    if (__src != (ON_MeshParameters *)0x0) {
      __dest = (ON_MeshParameters *)operator_new(0xe0);
      memcpy(__dest,__src,0xe0);
      this->m_mesh_parameters = __dest;
    }
    iVar15 = src->m_quad_count;
    this->m_invalid_count = src->m_invalid_count;
    this->m_quad_count = iVar15;
    this->m_triangle_count = src->m_triangle_count;
    cVar11 = src->m_mesh_is_manifold;
    cVar12 = src->m_mesh_is_oriented;
    cVar13 = src->m_mesh_is_solid;
    this->m_mesh_is_closed = src->m_mesh_is_closed;
    this->m_mesh_is_manifold = cVar11;
    this->m_mesh_is_oriented = cVar12;
    this->m_mesh_is_solid = cVar13;
    dVar5 = (src->m_vertex_bbox).m_min.y;
    dVar6 = (src->m_vertex_bbox).m_min.z;
    dVar7 = (src->m_vertex_bbox).m_max.x;
    dVar8 = (src->m_vertex_bbox).m_max.y;
    dVar9 = (src->m_vertex_bbox).m_max.z;
    (this->m_vertex_bbox).m_min.x = (src->m_vertex_bbox).m_min.x;
    (this->m_vertex_bbox).m_min.y = dVar5;
    (this->m_vertex_bbox).m_min.z = dVar6;
    (this->m_vertex_bbox).m_max.x = dVar7;
    (this->m_vertex_bbox).m_max.y = dVar8;
    (this->m_vertex_bbox).m_max.z = dVar9;
    memcpy(&this->m_tight_bbox_cache,&src->m_tight_bbox_cache,0x248);
    uVar4 = *(undefined8 *)(src->m_nbox[0] + 2);
    *(undefined8 *)this->m_nbox[0] = *(undefined8 *)src->m_nbox[0];
    *(undefined8 *)(this->m_nbox[0] + 2) = uVar4;
    *(undefined8 *)(this->m_nbox[1] + 1) = *(undefined8 *)(src->m_nbox[1] + 1);
    afVar10 = src->m_tbox[1];
    this->m_tbox[0] = src->m_tbox[0];
    this->m_tbox[1] = afVar10;
    lVar17 = 0;
    do {
      pOVar3 = this->m_kstat[lVar17];
      if (pOVar3 != (ON_MeshCurvatureStats *)0x0) {
        ON_MeshCurvatureStats::~ON_MeshCurvatureStats(pOVar3);
        operator_delete(pOVar3,0x40);
        this->m_kstat[lVar17] = (ON_MeshCurvatureStats *)0x0;
      }
      pOVar3 = src->m_kstat[lVar17];
      if (pOVar3 != (ON_MeshCurvatureStats *)0x0) {
        this_00 = (ON_MeshCurvatureStats *)operator_new(0x40);
        ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_00,pOVar3);
        this->m_kstat[lVar17] = this_00;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
  }
  return this;
}

Assistant:

ON_Mesh& ON_Mesh::operator=( const ON_Mesh& src )
{
  if ( this != &src ) 
  {
    Destroy();
    ON_Geometry::operator=(src);

    m_V  = src.m_V;
    m_dV = src.m_dV;
    m_F  = src.m_F;
    m_N  = src.m_N;
    m_FN = src.m_FN;
    m_T  = src.m_T;
    m_TC = src.m_TC;
    m_S  = src.m_S;
    m_H  = src.m_H;
    m_hidden_count = src.m_hidden_count;


    unsigned int ngon_count = src.HasNgons() ? src.m_Ngon.UnsignedCount() : 0;
    if ( ngon_count > 0 )
    {
      const unsigned int src_V_count = src.m_V.UnsignedCount();
      const unsigned int src_F_count = src.m_F.UnsignedCount();
      m_Ngon.Reserve(ngon_count);
      for ( unsigned int i = 0; i < ngon_count; i++ )
      {
        const ON_MeshNgon* src_ngon = src.m_Ngon[i];
        if ( 0 == src_ngon )
          continue;
        if ( src_ngon->m_Vcount <= 0 )
          continue;
        if ( 0 == src_ngon->m_vi )
          continue;
        if ( src_ngon->m_Vcount > src_V_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( src_ngon->m_Fcount > src_F_count )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        if ( 0 == src_ngon->m_fi && src_ngon->m_Fcount > 0 )
        {
          ON_ERROR("Corrupt ngon");
          continue;
        }
        ON_MeshNgon* ngon = m_NgonAllocator.CopyNgon(src_ngon);
        if (ngon)
          m_Ngon.Append(ngon);
      }
      if ( 0 != src.NgonMap())
      {
        this->CreateNgonMap();
      }
    }

    m_Ctag = src.m_Ctag;
    m_Ttag = src.m_Ttag;
    m_packed_tex_domain[0] = src.m_packed_tex_domain[0];
    m_packed_tex_domain[1] = src.m_packed_tex_domain[1];
    m_srf_domain[0] = src.m_srf_domain[0];
    m_srf_domain[1] = src.m_srf_domain[1];
    m_srf_scale[0] = src.m_srf_scale[0];
    m_srf_scale[1] = src.m_srf_scale[1];
    m_packed_tex_rotate = src.m_packed_tex_rotate;

    m_K = src.m_K;
    m_C = src.m_C;

    m_parent         = src.m_parent;
    //m_material_index = src.m_material_index;

    if ( m_mesh_parameters ) {
      delete m_mesh_parameters;
      m_mesh_parameters = 0;
    }
    if ( src.m_mesh_parameters )
      m_mesh_parameters = new ON_MeshParameters(*src.m_mesh_parameters);

    m_invalid_count = src.m_invalid_count;
    m_quad_count = src.m_quad_count;
    m_triangle_count = src.m_triangle_count;

    m_mesh_is_closed = src.m_mesh_is_closed;
    m_mesh_is_manifold = src.m_mesh_is_manifold;
    m_mesh_is_oriented = src.m_mesh_is_oriented;
    m_mesh_is_solid    = src.m_mesh_is_solid;

    m_vertex_bbox = src.m_vertex_bbox;
    m_tight_bbox_cache = src.m_tight_bbox_cache;
    memcpy(m_nbox,src.m_nbox,sizeof(m_nbox));
    memcpy(m_tbox,src.m_tbox,sizeof(m_tbox));

    int i;
    for ( i = 0; i < 4; i++ ) {
      if ( m_kstat[i] ) 
      {
        delete m_kstat[i];
        m_kstat[i] = 0;
      }
      if ( src.m_kstat[i] )
      {
        m_kstat[i] = new ON_MeshCurvatureStats(*src.m_kstat[i]);
      }
    }

    // do not copy m_top

    // Do not copy m_mesh_cache. Cached information will
    // be recalculated if it is needed.
  }
  return *this;
}